

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::
join<char_const(&)[9],char_const*&,char_const(&)[2],char_const*&,char_const(&)[9],char_const(&)[9],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [9],char **ts_1,
          char (*ts_2) [2],char **ts_3,char (*ts_4) [9],char (*ts_5) [9],char **ts_6,
          char (*ts_7) [13],char **ts_8,char (*ts_9) [4])

{
  undefined1 local_1140 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [9];
  char **ts_local_3;
  char (*ts_local_2) [2];
  char **ts_local_1;
  char (*ts_local) [9];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1140);
  inner::
  join_helper<char_const(&)[9],char_const*&,char_const(&)[2],char_const*&,char_const(&)[9],char_const(&)[9],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
            ((StringStream<4096UL,_4096UL> *)local_1140,(char (*) [9])this,(char **)ts,
             (char (*) [2])ts_1,(char **)ts_2,
             (char (*) [9])stream.saved_buffers.stack_storage.aligned_char._184_8_,ts_4,
             (char **)ts_5,(char (*) [13])ts_6,(char **)ts_7,(char (*) [4])ts_8);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1140);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1140);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}